

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall cmInstallScriptGenerator::GenerateScript(cmInstallScriptGenerator *this,ostream *os)

{
  cmScriptGeneratorIndent cVar1;
  char *component;
  ostream *poVar2;
  undefined1 local_40 [8];
  string component_test;
  Indent indent;
  ostream *os_local;
  cmInstallScriptGenerator *this_local;
  
  cmScriptGeneratorIndent::cmScriptGeneratorIndent
            ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc));
  component = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::CreateComponentTest_abi_cxx11_
            ((string *)local_40,&this->super_cmInstallGenerator,component,
             (bool)((this->super_cmInstallGenerator).ExcludeFromAll & 1));
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)component_test.field_2._12_4_);
  poVar2 = std::operator<<(poVar2,"if(");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  std::operator<<(poVar2,")\n");
  if ((this->Code & 1U) == 0) {
    cVar1 = cmScriptGeneratorIndent::Next
                      ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc),2);
    poVar2 = ::operator<<(os,cVar1);
    poVar2 = std::operator<<(poVar2,"include(\"");
    poVar2 = std::operator<<(poVar2,(string *)&this->Script);
    std::operator<<(poVar2,"\")\n");
  }
  else {
    cVar1 = cmScriptGeneratorIndent::Next
                      ((cmScriptGeneratorIndent *)((long)&component_test.field_2 + 0xc),2);
    poVar2 = ::operator<<(os,cVar1);
    poVar2 = std::operator<<(poVar2,(string *)&this->Script);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)component_test.field_2._12_4_);
  std::operator<<(poVar2,"endif()\n\n");
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScript(std::ostream& os)
{
  Indent indent;
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str(), this->ExcludeFromAll);
  os << indent << "if(" << component_test << ")\n";

  if (this->Code) {
    os << indent.Next() << this->Script << "\n";
  } else {
    os << indent.Next() << "include(\"" << this->Script << "\")\n";
  }

  os << indent << "endif()\n\n";
}